

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O2

Value * duckdb::HivePartitioning::GetValue
                  (Value *__return_storage_ptr__,ClientContext *context,string *key,string *str_val,
                  LogicalType *type)

{
  bool bVar1;
  InvalidInputException *this;
  LogicalType *this_00;
  allocator local_129;
  string *local_128;
  LogicalType local_120;
  LogicalType local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_128 = key;
  ::std::__cxx11::string::string((string *)&local_f0,"NULL",&local_129);
  bVar1 = StringUtil::CIEquals(str_val,&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  if (bVar1) {
    LogicalType::LogicalType(&local_108,type);
    Value::Value(__return_storage_ptr__,&local_108);
    this_00 = &local_108;
  }
  else {
    if (type->id_ == VARCHAR) {
      Unescape(&local_50,str_val);
      Value::Value(__return_storage_ptr__,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    if (str_val->_M_string_length != 0) {
      Unescape(&local_70,str_val);
      Value::Value(__return_storage_ptr__,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      bVar1 = Value::TryCastAs(__return_storage_ptr__,context,type,false);
      if (bVar1) {
        return __return_storage_ptr__;
      }
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_f0,
                 "Unable to cast \'%s\' (from hive partition column \'%s\') to: \'%s\'",&local_129);
      Value::ToString_abi_cxx11_(&local_90,__return_storage_ptr__);
      StringUtil::Upper(&local_b0,local_128);
      LogicalType::ToString_abi_cxx11_(&local_d0,type);
      InvalidInputException::
      InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                 &local_b0,&local_d0);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_120,type);
    Value::Value(__return_storage_ptr__,&local_120);
    this_00 = &local_120;
  }
  LogicalType::~LogicalType(this_00);
  return __return_storage_ptr__;
}

Assistant:

Value HivePartitioning::GetValue(ClientContext &context, const string &key, const string &str_val,
                                 const LogicalType &type) {
	// Handle nulls
	if (StringUtil::CIEquals(str_val, "NULL")) {
		return Value(type);
	}
	if (type.id() == LogicalTypeId::VARCHAR) {
		// for string values we can directly return the type
		return Value(Unescape(str_val));
	}
	if (str_val.empty()) {
		// empty strings are NULL for non-string types
		return Value(type);
	}

	// cast to the target type
	Value value(Unescape(str_val));
	if (!value.TryCastAs(context, type)) {
		throw InvalidInputException("Unable to cast '%s' (from hive partition column '%s') to: '%s'", value.ToString(),
		                            StringUtil::Upper(key), type.ToString());
	}
	return value;
}